

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

ValueType * __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<3>::find_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,pair<int,_int> *key)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  
  uVar7 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar12 = uVar7 >> 10;
  uVar13 = (this->occupation).occupation;
  if ((uVar13 >> (uVar12 & 0x3f) & 1) == 0) {
    return (ValueType *)0x0;
  }
  lVar11 = POPCOUNT(uVar13 >> ((byte)uVar12 & 0x3f));
  uVar7 = uVar7 & 0xffff;
  iVar6 = (int)lVar11 + -2;
  lVar3 = lVar11 * 8 + 8;
  lVar8 = 0;
  do {
    lVar9 = lVar8 + 8;
    iVar6 = iVar6 + 1;
    lVar4 = lVar8 + lVar3;
    lVar8 = lVar9;
  } while (uVar7 < *(ulong *)((long)(this->hashes)._M_elems + lVar4 + -0x10));
  iVar2 = this->size;
  if ((iVar2 == iVar6) ||
     (*(ulong *)((long)(this->hashes)._M_elems + lVar9 + lVar11 * 8 + -0x10) != uVar7)) {
    uVar13 = 0;
    iVar15 = iVar6;
  }
  else {
    uVar12 = (ulong)(uint)((int)lVar11 << 4);
    uVar13 = uVar12;
    do {
      uVar1 = *(undefined8 *)((long)((this->entries)._M_elems + -2) + lVar9 * 2 + uVar12);
      auVar14._0_4_ = -(uint)((int)uVar1 == (*key).first);
      iVar15 = -(uint)((int)((ulong)uVar1 >> 0x20) == (*key).second);
      auVar14._4_4_ = auVar14._0_4_;
      auVar14._8_4_ = iVar15;
      auVar14._12_4_ = iVar15;
      iVar10 = movmskpd((int)uVar13,auVar14);
      uVar13 = (ulong)CONCAT31((int3)((uint)iVar10 >> 8),iVar10 == 3);
      iVar15 = iVar6;
      if ((iVar10 == 3) || (iVar15 = iVar2, iVar6 - iVar2 == -1)) break;
      iVar6 = iVar6 + 1;
      lVar8 = lVar9 + lVar3;
      lVar9 = lVar9 + 8;
      iVar15 = iVar6;
    } while (*(ulong *)((long)(this->hashes)._M_elems + lVar8 + -0x10) == uVar7);
  }
  pdVar5 = (double *)0x0;
  if ((char)uVar13 != '\0') {
    pdVar5 = &(this->entries)._M_elems[iVar15].value_;
  }
  return pdVar5;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }